

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcppacketbuilder.cpp
# Opt level: O2

int __thiscall
jrtplib::RTCPPacketBuilder::BuildBYEPacket
          (RTCPPacketBuilder *this,RTCPCompoundPacket **pack,void *reason,size_t reasonlength,
          bool useSRifpossible)

{
  double dVar1;
  RTPInternalSourceData *pRVar2;
  RTPPacketBuilder *pRVar3;
  uint8_t *itemdata;
  size_t sVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  RTCPCompoundPacketBuilder *this_00;
  uint32_t senderssrc;
  uint32_t packetcount;
  uint32_t octetcount;
  size_t sVar8;
  bool bVar9;
  double dVar10;
  uint32_t ssrcs [1];
  undefined4 uStack_44;
  RTPNTPTime ntptimestamp;
  
  if (this->init != true) {
    return -0x32;
  }
  sVar8 = 0xff;
  if (reasonlength < 0xff) {
    sVar8 = reasonlength;
  }
  *pack = (RTCPCompoundPacket *)0x0;
  this_00 = (RTCPCompoundPacketBuilder *)operator_new(0x130,(this->super_RTPMemoryObject).mgr,0x11);
  RTCPCompoundPacketBuilder::RTCPCompoundPacketBuilder(this_00,(this->super_RTPMemoryObject).mgr);
  iVar5 = RTCPCompoundPacketBuilder::InitBuild(this_00,this->maxpacketsize);
  if (iVar5 < 0) {
LAB_0013067f:
    RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,(this->super_RTPMemoryObject).mgr);
  }
  else {
    senderssrc = 0;
    if (this->rtppacketbuilder->init != false) {
      senderssrc = this->rtppacketbuilder->ssrc;
    }
    if (((useSRifpossible) &&
        (pRVar2 = this->sources->owndata, pRVar2 != (RTPInternalSourceData *)0x0)) &&
       ((pRVar2->super_RTPSourceData).issender == true)) {
      _ssrcs = RTPTime::CurrentTime();
      pRVar3 = this->rtppacketbuilder;
      uVar7 = 0;
      bVar9 = pRVar3->init != false;
      if (bVar9) {
        dVar10 = (pRVar3->lastwallclocktime).m_t;
      }
      else {
        dVar10 = 0.0;
      }
      packetcount = 0;
      octetcount = 0;
      if (bVar9) {
        uVar7 = pRVar3->lastrtptimestamp;
        packetcount = pRVar3->numpackets;
        octetcount = pRVar3->numpayloadbytes;
      }
      dVar10 = _ssrcs - dVar10;
      dVar1 = this->timestampunit;
      ntptimestamp = RTPTime::GetNTPTime((RTPTime *)ssrcs);
      iVar5 = RTCPCompoundPacketBuilder::StartSenderReport
                        (this_00,senderssrc,&ntptimestamp,(int)(long)(dVar10 / dVar1 + 0.5) + uVar7,
                         packetcount,octetcount);
    }
    else {
      iVar5 = RTCPCompoundPacketBuilder::StartReceiverReport(this_00,senderssrc);
    }
    if (iVar5 < 0) {
      RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,(this->super_RTPMemoryObject).mgr);
      if (iVar5 == -0x2b) {
        return -0x33;
      }
      return iVar5;
    }
    itemdata = (this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[0].str;
    sVar4 = (this->ownsdesinfo).super_RTCPSDESInfo.nonprivateitems[0].length;
    iVar6 = RTCPCompoundPacketBuilder::AddSDESSource(this_00,senderssrc);
    if ((-1 < iVar6) &&
       (iVar6 = RTCPCompoundPacketBuilder::AddSDESNormalItem(this_00,CNAME,itemdata,(uint8_t)sVar4),
       -1 < iVar6)) {
      ssrcs[0] = senderssrc;
      iVar6 = RTCPCompoundPacketBuilder::AddBYEPacket(this_00,ssrcs,'\x01',reason,(uint8_t)sVar8);
      if (-1 < iVar6) {
        iVar5 = RTCPCompoundPacketBuilder::EndBuild(this_00);
        if (-1 < iVar5) {
          *pack = (RTCPCompoundPacket *)this_00;
          return 0;
        }
        goto LAB_0013067f;
      }
    }
    RTPDelete<jrtplib::RTCPCompoundPacketBuilder>(this_00,(this->super_RTPMemoryObject).mgr);
    iVar5 = -0x33;
    if (iVar6 != -0x2b) {
      iVar5 = iVar6;
    }
  }
  return iVar5;
}

Assistant:

int RTCPPacketBuilder::BuildBYEPacket(RTCPCompoundPacket **pack,const void *reason,size_t reasonlength,bool useSRifpossible)
{
	if (!init)
		return ERR_RTP_RTCPPACKETBUILDER_NOTINIT;

	RTCPCompoundPacketBuilder *rtcpcomppack;
	int status;
	
	if (reasonlength > 255)
		reasonlength = 255;
	
	*pack = 0;
	
	rtcpcomppack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTCPCOMPOUNDPACKETBUILDER) RTCPCompoundPacketBuilder(GetMemoryManager());
	if (rtcpcomppack == 0)
		return ERR_RTP_OUTOFMEM;
	
	if ((status = rtcpcomppack->InitBuild(maxpacketsize)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		return status;
	}
	
	uint32_t ssrc = rtppacketbuilder.GetSSRC();
	bool useSR = false;
	
	if (useSRifpossible)
	{
		RTPSourceData *srcdat;
		
		if ((srcdat = sources.GetOwnSourceInfo()) != 0)
		{
			if (srcdat->IsSender())
				useSR = true;
		}
	}
			
	if (useSR)
	{
		RTPTime curtime = RTPTime::CurrentTime();
		RTPTime rtppacktime = rtppacketbuilder.GetPacketTime();
		uint32_t rtppacktimestamp = rtppacketbuilder.GetPacketTimestamp();
		uint32_t packcount = rtppacketbuilder.GetPacketCount();
		uint32_t octetcount = rtppacketbuilder.GetPayloadOctetCount();
		RTPTime diff = curtime;
		diff -= rtppacktime;
		
		uint32_t tsdiff = (uint32_t)((diff.GetDouble()/timestampunit)+0.5);
		uint32_t rtptimestamp = rtppacktimestamp+tsdiff;
		RTPNTPTime ntptimestamp = curtime.GetNTPTime();

		if ((status = rtcpcomppack->StartSenderReport(ssrc,ntptimestamp,rtptimestamp,packcount,octetcount)) < 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
			return status;
		}
	}
	else
	{
		if ((status = rtcpcomppack->StartReceiverReport(ssrc)) < 0)
		{
			RTPDelete(rtcpcomppack,GetMemoryManager());
			if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
				return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
			return status;
		}
	}

	uint8_t *owncname;
	size_t owncnamelen;

	owncname = ownsdesinfo.GetCNAME(&owncnamelen);

	if ((status = rtcpcomppack->AddSDESSource(ssrc)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		return status;
	}
	if ((status = rtcpcomppack->AddSDESNormalItem(RTCPSDESPacket::CNAME,owncname,owncnamelen)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		return status;
	}

	uint32_t ssrcs[1];

	ssrcs[0] = ssrc;
	
	if ((status = rtcpcomppack->AddBYEPacket(ssrcs,1,(const uint8_t *)reason,reasonlength)) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		if (status == ERR_RTP_RTCPCOMPPACKBUILDER_NOTENOUGHBYTESLEFT)
			return ERR_RTP_RTCPPACKETBUILDER_PACKETFILLEDTOOSOON;
		return status;
	}
	
	if ((status = rtcpcomppack->EndBuild()) < 0)
	{
		RTPDelete(rtcpcomppack,GetMemoryManager());
		return status;
	}

	*pack = rtcpcomppack;
	return 0;
}